

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

DefinitionSymbol * __thiscall
slang::ast::Compilation::getDefinition
          (Compilation *this,ConfigBlockSymbol *config,string_view cellName,string_view libName,
          SourceRange sourceRange)

{
  group_type_pointer pgVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RootSymbol *pRVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  pointer ppSVar7;
  DefinitionSymbol *pDVar8;
  SourceLibrary *pSVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  SourceLibrary *pSVar16;
  Diagnostic *this_00;
  char *__s;
  size_type __len2;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  size_t __n;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 __s1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar20;
  size_type __rlen;
  pointer ppSVar21;
  ulong uVar22;
  value_type_pointer __u;
  undefined1 auVar23 [16];
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  byte bVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  byte bVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  byte bVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  byte bVar39;
  format_args args;
  string_view fmt;
  string errorName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  group_type_pointer local_b8;
  ulong local_b0;
  ulong local_a8;
  ConfigBlockSymbol *local_a0;
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  byte bStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  byte bStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  byte bStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  byte bStack_89;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  byte bStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  byte bStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  string local_78;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_58;
  size_type local_50;
  char *local_48;
  size_type local_40;
  
  __s = cellName._M_str;
  __len2 = cellName._M_len;
  __s1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)libName._M_str;
  __n = libName._M_len;
  pRVar3 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  local_58.values_ = (value<fmt::v11::context> *)&pRVar3->super_Scope;
  if (pRVar3 == (RootSymbol *)0x0) {
    local_58.values_ = (value<fmt::v11::context> *)0x0;
  }
  local_d8._M_dataplus._M_p = (pointer)0x0;
  aVar20 = __s1;
  local_a0 = config;
  local_50 = __len2;
  local_48 = __s;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply((size_t *)&local_d8,
          (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *
          )&local_58);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_d8._M_dataplus._M_p;
  uVar22 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,0);
  uVar18 = uVar22 >> ((byte)(this->definitionMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar19 = (uVar22 & 0xff) * 4;
  uVar24 = (&UNK_004a938c)[lVar19];
  uVar25 = (&UNK_004a938d)[lVar19];
  uVar26 = (&UNK_004a938e)[lVar19];
  bVar27 = (&UNK_004a938f)[lVar19];
  uVar17 = 0;
  uVar28 = uVar24;
  uVar29 = uVar25;
  uVar30 = uVar26;
  bVar31 = bVar27;
  uVar32 = uVar24;
  uVar33 = uVar25;
  uVar34 = uVar26;
  bVar35 = bVar27;
  uVar36 = uVar24;
  uVar37 = uVar25;
  uVar38 = uVar26;
  bVar39 = bVar27;
  do {
    pgVar4 = (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar4 + uVar18;
    local_88 = pgVar1->m[0].n;
    uStack_87 = pgVar1->m[1].n;
    uStack_86 = pgVar1->m[2].n;
    bStack_85 = pgVar1->m[3].n;
    uStack_84 = pgVar1->m[4].n;
    uStack_83 = pgVar1->m[5].n;
    uStack_82 = pgVar1->m[6].n;
    bStack_81 = pgVar1->m[7].n;
    uStack_80 = pgVar1->m[8].n;
    uStack_7f = pgVar1->m[9].n;
    uStack_7e = pgVar1->m[10].n;
    bStack_7d = pgVar1->m[0xb].n;
    uStack_7c = pgVar1->m[0xc].n;
    uStack_7b = pgVar1->m[0xd].n;
    uStack_7a = pgVar1->m[0xe].n;
    bVar13 = pgVar1->m[0xf].n;
    auVar23[0] = -(local_88 == uVar24);
    auVar23[1] = -(uStack_87 == uVar25);
    auVar23[2] = -(uStack_86 == uVar26);
    auVar23[3] = -(bStack_85 == bVar27);
    auVar23[4] = -(uStack_84 == uVar28);
    auVar23[5] = -(uStack_83 == uVar29);
    auVar23[6] = -(uStack_82 == uVar30);
    auVar23[7] = -(bStack_81 == bVar31);
    auVar23[8] = -(uStack_80 == uVar32);
    auVar23[9] = -(uStack_7f == uVar33);
    auVar23[10] = -(uStack_7e == uVar34);
    auVar23[0xb] = -(bStack_7d == bVar35);
    auVar23[0xc] = -(uStack_7c == uVar36);
    auVar23[0xd] = -(uStack_7b == uVar37);
    auVar23[0xe] = -(uStack_7a == uVar38);
    auVar23[0xf] = -(bVar13 == bVar39);
    uVar14 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
    bStack_79 = bVar13;
    if (uVar14 != 0) {
      local_b8 = pgVar4 + uVar18;
      ppVar5 = (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.elements_;
      local_b0 = uVar18;
      local_a8 = uVar17;
      local_98 = uVar24;
      uStack_97 = uVar25;
      uStack_96 = uVar26;
      bStack_95 = bVar27;
      uStack_94 = uVar28;
      uStack_93 = uVar29;
      uStack_92 = uVar30;
      bStack_91 = bVar31;
      uStack_90 = uVar32;
      uStack_8f = uVar33;
      uStack_8e = uVar34;
      bStack_8d = bVar35;
      uStack_8c = uVar36;
      uStack_8b = uVar37;
      uStack_8a = uVar38;
      bStack_89 = bVar39;
      do {
        uVar10 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        __u = ppVar5 + uVar18 * 0xf + (ulong)uVar10;
        bVar12 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                 ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         *)&local_58,&__u->first);
        if (bVar12) {
          ppSVar21 = (__u->second).first.
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppSVar7 = (__u->second).first.
                    super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          goto joined_r0x002debe8;
        }
        uVar14 = uVar14 - 1 & uVar14;
      } while (uVar14 != 0);
      bVar13 = local_b8->m[0xf].n;
      uVar17 = local_a8;
      uVar18 = local_b0;
      uVar24 = local_98;
      uVar25 = uStack_97;
      uVar26 = uStack_96;
      bVar27 = bStack_95;
      uVar28 = uStack_94;
      uVar29 = uStack_93;
      uVar30 = uStack_92;
      bVar31 = bStack_91;
      uVar32 = uStack_90;
      uVar33 = uStack_8f;
      uVar34 = uStack_8e;
      bVar35 = bStack_8d;
      uVar36 = uStack_8c;
      uVar37 = uStack_8b;
      uVar38 = uStack_8a;
      bVar39 = bStack_89;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bVar13) == 0) break;
    uVar6 = (this->definitionMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
            .arrays.groups_size_mask;
    lVar19 = uVar18 + uVar17;
    uVar17 = uVar17 + 1;
    uVar18 = lVar19 + 1U & uVar6;
  } while (uVar17 <= uVar6);
LAB_002dec44:
  paVar2 = &local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  if (__n == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_d8,0,0,__s,__len2);
  }
  else {
    args.field_1.args_ = aVar20.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x5;
    local_58 = __s1;
    local_50 = __n;
    local_48 = __s;
    local_40 = __len2;
    ::fmt::v11::vformat_abi_cxx11_(&local_78,(v11 *)0x4d2a1e,fmt,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_d8,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = Scope::addDiag(&((this->root)._M_t.
                             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                            super_Scope,(DiagCode)0x10000d,sourceRange);
  Diagnostic::operator<<(this_00,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return (DefinitionSymbol *)0x0;
joined_r0x002debe8:
  if (ppSVar21 == ppSVar7) goto LAB_002dec44;
  pDVar8 = (DefinitionSymbol *)*ppSVar21;
  if ((pDVar8->super_Symbol).kind == Definition) {
    pSVar9 = pDVar8->sourceLibrary;
    if ((pSVar9->name)._M_string_length == __n) {
      if ((__n == 0) ||
         (iVar15 = bcmp(__s1.values_,(pSVar9->name)._M_dataplus._M_p,__n), iVar15 == 0))
      goto LAB_002decd7;
    }
    else if ((__n == 0) &&
            (pSVar16 = Symbol::getSourceLibrary(&local_a0->super_Symbol), pSVar9 == pSVar16)) {
LAB_002decd7:
      if ((pDVar8->definitionKind & ~Program) == Module) {
        return pDVar8;
      }
      goto LAB_002dec44;
    }
  }
  ppSVar21 = ppSVar21 + 1;
  goto joined_r0x002debe8;
}

Assistant:

const DefinitionSymbol* Compilation::getDefinition(const ConfigBlockSymbol& config,
                                                   std::string_view cellName,
                                                   std::string_view libName,
                                                   SourceRange sourceRange) const {
    if (auto defIt = definitionMap.find(std::tuple{cellName, root.get()});
        defIt != definitionMap.end()) {

        const DefinitionSymbol* foundDef = nullptr;
        for (auto defSym : defIt->second.first) {
            if (defSym->kind != SymbolKind::Definition)
                continue;

            auto& def = defSym->as<DefinitionSymbol>();
            if (def.sourceLibrary.name == libName ||
                (libName.empty() && &def.sourceLibrary == config.getSourceLibrary())) {
                foundDef = &def;
                break;
            }
        }

        if (foundDef && (foundDef->definitionKind == DefinitionKind::Module ||
                         foundDef->definitionKind == DefinitionKind::Program)) {
            return foundDef;
        }
    }

    std::string errorName;
    if (!libName.empty())
        errorName = fmt::format("{}.{}", libName, cellName);
    else
        errorName = cellName;

    root->addDiag(diag::InvalidTopModule, sourceRange) << errorName;
    return nullptr;
}